

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyFileSize(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    puts("Scl_LibertyFileSize(): The input file is unavailable (absent or open).");
    iVar1 = 0;
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int Scl_LibertyFileSize( char * pFileName )
{
    FILE * pFile;
    int nFileSize;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Scl_LibertyFileSize(): The input file is unavailable (absent or open).\n" );
        return 0;
    }
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile ); 
    fclose( pFile );
    return nFileSize;
}